

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CumSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_cumsum(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x5af) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5af;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.cumsum_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CumSumLayerParams>
                   (arena);
    (this->layer_).cumsum_ = (CumSumLayerParams *)LVar2;
  }
  return (CumSumLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::CumSumLayerParams* NeuralNetworkLayer::_internal_mutable_cumsum() {
  if (!_internal_has_cumsum()) {
    clear_layer();
    set_has_cumsum();
    layer_.cumsum_ = CreateMaybeMessage< ::CoreML::Specification::CumSumLayerParams >(GetArenaForAllocation());
  }
  return layer_.cumsum_;
}